

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.cpp
# Opt level: O3

int32_t decGetInt(decNumber *dn)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  uint32_t *puVar4;
  uint uVar5;
  uint8_t *puVar6;
  uint uVar7;
  
  bVar1 = dn->bits;
  if ((dn->digits == 1 && dn->lsu[0] == '\0') && (bVar1 & 0x70) == 0) {
    return 0;
  }
  uVar5 = dn->exponent;
  puVar6 = dn->lsu;
  if ((int)uVar5 < 0) {
    iVar2 = 1 - uVar5;
    do {
      if (*puVar6 != 0) {
        return -0x80000000;
      }
      puVar6 = puVar6 + 1;
      iVar2 = iVar2 + -1;
    } while (1 < iVar2);
LAB_002489ad:
    uVar3 = (uint)*puVar6;
    puVar6 = puVar6 + 1;
    uVar7 = 1;
  }
  else {
    uVar3 = 0;
    uVar7 = uVar5;
    if (uVar5 == 0) goto LAB_002489ad;
  }
  iVar2 = uVar5 + dn->digits;
  if (iVar2 < 0xb) {
    uVar5 = uVar3;
    if ((int)uVar7 < iVar2) {
      puVar4 = DECPOWERS + uVar7;
      do {
        uVar5 = uVar5 + (uint)*puVar6 * *puVar4;
        puVar6 = puVar6 + 1;
        puVar4 = puVar4 + 1;
        uVar7 = uVar7 + 1;
      } while ((int)uVar7 < iVar2);
    }
    if (iVar2 == 10) {
      if ((((int)uVar5 / (int)DECPOWERS[uVar7 - 1] != (uint)puVar6[-1]) ||
          ((char)bVar1 < '\0' && 0x773593fd < (int)uVar5)) ||
         (999999999 < (int)uVar5 && -1 < (char)bVar1)) goto LAB_00248a35;
    }
    uVar7 = -uVar5;
    if (-1 < (char)bVar1) {
      uVar7 = uVar5;
    }
  }
  else {
LAB_00248a35:
    uVar7 = uVar3 & 1 | 0x80000002;
  }
  return uVar7;
}

Assistant:

static Int decGetInt(const decNumber *dn) {
  Int  theInt;                          /* result accumulator  */
  const Unit *up;                       /* work  */
  Int  got;                             /* digits (real or not) processed  */
  Int  ilength=dn->digits+dn->exponent; /* integral length  */
  Flag neg=decNumberIsNegative(dn);     /* 1 if -ve  */

  /* The number must be an integer that fits in 10 digits  */
  /* Assert, here, that 10 is enough for any rescale Etiny  */
  #if DEC_MAX_EMAX > 999999999
    #error GetInt may need updating [for Emax]
  #endif
  #if DEC_MIN_EMIN < -999999999
    #error GetInt may need updating [for Emin]
  #endif
  if (ISZERO(dn)) return 0;             /* zeros are OK, with any exponent  */

  up=dn->lsu;                           /* ready for lsu  */
  theInt=0;                             /* ready to accumulate  */
  if (dn->exponent>=0) {                /* relatively easy  */
    /* no fractional part [usual]; allow for positive exponent  */
    got=dn->exponent;
    }
   else { /* -ve exponent; some fractional part to check and discard  */
    Int count=-dn->exponent;            /* digits to discard  */
    /* spin up whole units until reach the Unit with the unit digit  */
    for (; count>=DECDPUN; up++) {
      if (*up!=0) return BADINT;        /* non-zero Unit to discard  */
      count-=DECDPUN;
      }
    if (count==0) got=0;                /* [a multiple of DECDPUN]  */
     else {                             /* [not multiple of DECDPUN]  */
      Int rem;                          /* work  */
      /* slice off fraction digits and check for non-zero  */
      #if DECDPUN<=4
        theInt=QUOT10(*up, count);
        rem=*up-theInt*powers[count];
      #else
        rem=*up%powers[count];          /* slice off discards  */
        theInt=*up/powers[count];
      #endif
      if (rem!=0) return BADINT;        /* non-zero fraction  */
      /* it looks good  */
      got=DECDPUN-count;                /* number of digits so far  */
      up++;                             /* ready for next  */
      }
    }
  /* now it's known there's no fractional part  */

  /* tricky code now, to accumulate up to 9.3 digits  */
  if (got==0) {theInt=*up; got+=DECDPUN; up++;} /* ensure lsu is there  */

  if (ilength<11) {
    Int save=theInt;
    /* collect any remaining unit(s)  */
    for (; got<ilength; up++) {
      theInt+=*up*powers[got];
      got+=DECDPUN;
      }
    if (ilength==10) {                  /* need to check for wrap  */
      if (theInt/(Int)powers[got-DECDPUN]!=(Int)*(up-1)) ilength=11;
         /* [that test also disallows the BADINT result case]  */
       else if (neg && theInt>1999999997) ilength=11;
       else if (!neg && theInt>999999999) ilength=11;
      if (ilength==11) theInt=save;     /* restore correct low bit  */
      }
    }

  if (ilength>10) {                     /* too big  */
    if (theInt&1) return BIGODD;        /* bottom bit 1  */
    return BIGEVEN;                     /* bottom bit 0  */
    }

  if (neg) theInt=-theInt;              /* apply sign  */
  return theInt;
  }